

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_b44ed7::TransformSelectorFor::Validate(TransformSelectorFor *this,size_t count)

{
  int iVar1;
  int *piVar2;
  int r;
  int iVar3;
  transform_error *this_00;
  int *piVar4;
  string sStack_98;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  
  iVar3 = TransformSelectorIndexes::NormalizeIndex
                    (&this->super_TransformSelectorIndexes,this->Start,count);
  this->Start = iVar3;
  iVar3 = TransformSelectorIndexes::NormalizeIndex
                    (&this->super_TransformSelectorIndexes,this->Stop,count);
  this->Stop = iVar3;
  if (this->Start <= iVar3) {
    iVar3 = (iVar3 - this->Start) + 1;
    std::vector<int,_std::allocator<int>_>::resize
              (&(this->super_TransformSelectorIndexes).Indexes,
               (long)(int)((iVar3 / this->Step + 1) - (uint)(iVar3 % this->Step == 0)));
    iVar3 = this->Start;
    iVar1 = this->Step;
    piVar2 = (this->super_TransformSelectorIndexes).Indexes.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
    ;
    for (piVar4 = (this->super_TransformSelectorIndexes).Indexes.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start; piVar4 != piVar2; piVar4 = piVar4 + 1) {
      *piVar4 = iVar3;
      iVar3 = iVar3 + iVar1;
    }
    return true;
  }
  this_00 = (transform_error *)__cxa_allocate_exception(0x10);
  local_78.View_._M_len = 0x52;
  local_78.View_._M_str =
       "sub-command TRANSFORM, selector FOR expects <start> to be no greater than <stop> (";
  cmAlphaNum::cmAlphaNum(&local_48,this->Start);
  cmStrCat<char[4],int,char[2]>
            (&sStack_98,&local_78,&local_48,(char (*) [4])" > ",&this->Stop,(char (*) [2])0x5f0fa4);
  transform_error::transform_error(this_00,&sStack_98);
  __cxa_throw(this_00,&(anonymous_namespace)::transform_error::typeinfo,
              std::runtime_error::~runtime_error);
}

Assistant:

bool Validate(std::size_t count) override
  {
    this->Start = this->NormalizeIndex(this->Start, count);
    this->Stop = this->NormalizeIndex(this->Stop, count);

    // Does stepping move us further from the end?
    if (this->Start > this->Stop) {
      throw transform_error(
        cmStrCat("sub-command TRANSFORM, selector FOR "
                 "expects <start> to be no greater than <stop> (",
                 this->Start, " > ", this->Stop, ")"));
    }

    // compute indexes
    auto size = (this->Stop - this->Start + 1) / this->Step;
    if ((this->Stop - this->Start + 1) % this->Step != 0) {
      size += 1;
    }

    this->Indexes.resize(size);
    auto start = this->Start;
    auto step = this->Step;
    std::generate(this->Indexes.begin(), this->Indexes.end(),
                  [&start, step]() -> int {
                    auto r = start;
                    start += step;
                    return r;
                  });

    return true;
  }